

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uint32_t crc32(uint32_t seed,uchar *buf,size_t len)

{
  byte *local_30;
  uchar *p;
  size_t sStack_20;
  uint32_t crc;
  size_t len_local;
  uchar *buf_local;
  uint32_t seed_local;
  
  local_30 = buf;
  p._4_4_ = seed;
  for (sStack_20 = len; sStack_20 != 0; sStack_20 = sStack_20 - 1) {
    p._4_4_ = crc_32_tab[(p._4_4_ ^ *local_30) & 0xff] ^ p._4_4_ >> 8;
    local_30 = local_30 + 1;
  }
  return p._4_4_;
}

Assistant:

uint32_t crc32(uint32_t seed, const unsigned char *buf, size_t len)
{
    uint32_t crc = seed;
    const unsigned char *p = buf;

    while (len) {
        crc = crc_32_tab[(crc ^ *p++) & 0xff] ^ (crc >> 8);
        len--;
    }

    return crc;
}